

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpEncoder::WriteValueInternal(DbpEncoder *this,WriteStream *writer,int64_t *value)

{
  long lVar1;
  long b;
  long *in_RDX;
  long in_RDI;
  int64_t delta;
  WriteStream *in_stack_00000038;
  DbpEncoder *in_stack_00000040;
  
  b = *in_RDX - *(long *)(in_RDI + 0x10);
  *(long *)(in_RDI + 0x10) = *in_RDX;
  lVar1 = MinValue<long>(*(long *)(in_RDI + 0x18),b);
  *(long *)(in_RDI + 0x18) = lVar1;
  lVar1 = *(long *)(in_RDI + 0x4020);
  *(long *)(in_RDI + 0x4020) = lVar1 + 1;
  *(long *)(in_RDI + 0x20 + lVar1 * 8) = b;
  if (*(long *)(in_RDI + 0x4020) == 0x800) {
    WriteBlock(in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void WriteValueInternal(WriteStream &writer, const int64_t &value) {
		// 1. Compute the differences between consecutive elements. For the first element in the block,
		// use the last element in the previous block or, in the case of the first block,
		// use the first value of the whole sequence, stored in the header.

		// Subtractions in steps 1) and 2) may incur signed arithmetic overflow,
		// and so will the corresponding additions when decoding.
		// Overflow should be allowed and handled as wrapping around in 2’s complement notation
		// so that the original values are correctly restituted.
		// This may require explicit care in some programming languages
		// (for example by doing all arithmetic in the unsigned domain).
		const auto delta = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(previous_value));
		previous_value = value;
		// Compute the frame of reference (the minimum of the deltas in the block).
		min_delta = MinValue(min_delta, delta);
		// append. if block is full, write it out
		data[block_count++] = delta;
		if (block_count == BLOCK_SIZE_IN_VALUES) {
			WriteBlock(writer);
		}
	}